

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O1

size_type __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::erase
          (set<Color,_std::less<Color>_> *this,key_type *key)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (2 < uVar3) break;
    uVar1 = uVar3 + 1;
  } while (1 << ((byte)uVar3 & 0x1f) != *key);
  if (uVar3 < 3) {
    bVar2 = (char)(uVar3 + 1) - 1;
    bVar4 = '\x01' << (bVar2 & 0x1f);
    if ((*(uint *)this >> (bVar2 & 0x1f) & 1) != 0) {
      this->s = this->s - 1;
    }
    bVar2 = (byte)*(uint *)this;
    (this->a).a._M_elems[0] = ~bVar4 & bVar2;
    return (ulong)((bVar2 & bVar4) != 0);
  }
  __assert_fail("(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/include/magic_enum/magic_enum_containers.hpp"
                ,0x289,
                "reference magic_enum::containers::bitset<Color>::operator[](E) [E = Color, Index = magic_enum::containers::detail::indexing<Color>]"
               );
}

Assistant:

constexpr size_type erase(const key_type& key) noexcept {
    typename container_type::reference ref = a[key];
    bool res = ref;
    if (res) {
      --s;
    }
    ref = false;
    return res;
  }